

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O0

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::CameraParameters::generateCameraRays
          (CameraParameters *this,size_t dimX,size_t dimY,ImageOrigin origin)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  reference pvVar4;
  unsigned_long in_RCX;
  unsigned_long in_RDX;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_RDI;
  int in_R8D;
  float degrees;
  CameraParameters *pCVar7;
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar9;
  vec3 vVar10;
  vec<3,_float,_(glm::qualifier)0> vVar11;
  vec<3,_float,_(glm::qualifier)0> vVar12;
  size_t ind;
  vec3 worldRayDir;
  vec3 worldPos;
  vec3 screenPos3;
  size_t iX;
  size_t iY;
  size_t nPix;
  vec3 rootPos;
  vec4 viewport;
  mat4 projMat;
  mat4x4 viewMat;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *result;
  float in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffdf4;
  undefined8 in_stack_fffffffffffffdf8;
  vec<3,_float,_(glm::qualifier)0> *v2;
  CameraParameters *in_stack_fffffffffffffe00;
  vec<4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  vec<3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe20;
  undefined8 local_124;
  undefined4 local_11c;
  undefined8 local_118;
  undefined4 local_110;
  undefined8 local_10c;
  undefined4 local_104;
  unsigned_long local_100;
  ulong local_f8;
  undefined1 local_d9;
  long local_d8;
  undefined8 local_d0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c8;
  undefined8 local_c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b8;
  vec<4,float,(glm::qualifier)0> local_b4 [144];
  int local_24;
  unsigned_long local_20;
  unsigned_long local_18;
  undefined1 auVar5 [64];
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  getViewMat((CameraParameters *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  degrees = getFoVVerticalDegrees((CameraParameters *)0x451953);
  glm::radians<float>(degrees);
  getAspectRatioWidthOverHeight((CameraParameters *)0x451968);
  glm::infinitePerspective<float>
            (in_stack_fffffffffffffdf4.z,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
  auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  glm::vec<4,float,(glm::qualifier)0>::vec<double,double,unsigned_long,unsigned_long>
            (local_b4,0.0,0.0,local_18,local_20);
  vVar10 = getPosition(in_stack_fffffffffffffe00);
  local_c8 = vVar10.field_2;
  auVar6._0_8_ = vVar10._0_8_;
  auVar6._8_56_ = auVar8;
  local_d0 = vmovlpd_avx(auVar6._0_16_);
  local_d8 = local_18 * local_20;
  local_d9 = 0;
  local_c0 = local_d0;
  local_b8 = local_c8;
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x451a3b);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
           (size_type)in_stack_fffffffffffffe08,(allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x451a67);
  vVar12.field_2 = in_stack_fffffffffffffe14;
  vVar12.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffe18;
  vVar12.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  vVar11.field_2 = in_stack_fffffffffffffdf4;
  vVar11.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (int)in_stack_fffffffffffffdf8;
  vVar11.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  for (local_f8 = 0; local_f8 < local_20; local_f8 = local_f8 + 1) {
    local_100 = 0;
    while( true ) {
      v2 = vVar11._0_8_;
      auVar8 = auVar6._8_56_;
      if (local_18 <= local_100) break;
      if (local_24 == 0) {
        auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        glm::vec<3,float,(glm::qualifier)0>::vec<unsigned_long,unsigned_long,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_124,local_100,local_f8,0.0);
        v2 = vVar11._0_8_;
        local_10c = local_124;
        local_104 = local_11c;
      }
      else if (local_24 == 1) {
        auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        glm::vec<3,float,(glm::qualifier)0>::vec<unsigned_long,unsigned_long,double>
                  ((vec<3,float,(glm::qualifier)0> *)&local_118,local_100,local_20 - local_f8,0.0);
        v2 = vVar11._0_8_;
        local_10c = local_118;
        local_104 = local_110;
      }
      vVar11 = glm::unProject<float,float,(glm::qualifier)0>
                         (in_stack_fffffffffffffe20,vVar12._0_8_,
                          (mat<4,_4,_float,_(glm::qualifier)0> *)
                          CONCAT44(vVar12.field_2,in_stack_fffffffffffffe10),
                          in_stack_fffffffffffffe08);
      auVar5._0_8_ = vVar11._0_8_;
      auVar5._8_56_ = auVar8;
      in_stack_fffffffffffffe20 = (vec<3,_float,_(glm::qualifier)0> *)0x0;
      vmovlpd_avx(auVar5._0_16_);
      vVar12 = glm::operator-((vec<3,_float,_(glm::qualifier)0> *)in_stack_fffffffffffffe00,v2);
      pCVar7 = (CameraParameters *)0x0;
      auVar3._8_8_ = in_stack_fffffffffffffe20;
      auVar3._0_8_ = vVar12._0_8_;
      vmovlpd_avx(auVar3);
      vVar11 = glm::normalize<3,float,(glm::qualifier)0>
                         ((vec<3,_float,_(glm::qualifier)0> *)in_stack_fffffffffffffe00);
      aVar9 = vVar11.field_2;
      auVar6 = ZEXT464((uint)aVar9);
      auVar2._8_8_ = pCVar7;
      auVar2._0_8_ = vVar11._0_8_;
      uVar1 = vmovlpd_avx(auVar2);
      pvVar4 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[](in_RDI,local_f8 * local_18 + local_100);
      pvVar4->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
      pvVar4->field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
           (int)((ulong)uVar1 >> 0x20);
      pvVar4->field_2 = aVar9;
      local_100 = local_100 + 1;
      in_stack_fffffffffffffe00 = pCVar7;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<glm::vec3> CameraParameters::generateCameraRays(size_t dimX, size_t dimY, ImageOrigin origin) const {

  // TODO this has not been tested for the case where dimX/dimY do not match the aspectRatio for the cameraParams

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., dimX, dimY};
  glm::vec3 rootPos = getPosition();
  size_t nPix = dimX * dimY;

  // allocate output
  std::vector<glm::vec3> result(dimX * dimY);

  // populate the rays
  for (size_t iY = 0; iY < dimY; iY++) {
    for (size_t iX = 0; iX < dimX; iX++) {

      // populate the rays
      // (this arithmetic could certainly be optimized)

      glm::vec3 screenPos3;
      switch (origin) {
      case ImageOrigin::UpperLeft:
        screenPos3 = glm::vec3{iX, dimY - iY, 0.};
        break;
      case ImageOrigin::LowerLeft:
        screenPos3 = glm::vec3{iX, iY, 0.};
        break;
      }

      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);

      size_t ind = iY * dimX + iX;
      result[ind] = worldRayDir;
    }
  }

  return result;
}